

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O0

QList<QSimplexConstraint_*> * __thiscall
QGraphicsAnchorLayoutPrivate::constraintsFromSizeHints
          (QGraphicsAnchorLayoutPrivate *this,QList<QtGraphicsAnchorLayout::AnchorData_*> *anchors)

{
  double dVar1;
  double dVar2;
  long lVar3;
  AnchorVertex *pAVar4;
  AnchorData *pAVar5;
  bool bVar6;
  bool bVar7;
  int iVar8;
  AnchorVertex **ppAVar9;
  qsizetype qVar10;
  const_reference ppAVar11;
  double *pdVar12;
  void *pvVar13;
  QSimplexConstraint *this_00;
  QList<QtGraphicsAnchorLayout::AnchorData_*> *in_RDX;
  QList<QSimplexConstraint_*> *in_RDI;
  long in_FS_OFFSET;
  QSimplexConstraint *c_2;
  QSimplexConstraint *c_1;
  QSimplexConstraint *c;
  qreal boundedMax;
  qreal boundedMin;
  AnchorData *ad;
  int i;
  bool unboundedProblem;
  qreal actualMax;
  qreal expectedMax;
  AnchorData *layoutEdge;
  Orientation orient;
  QList<QSimplexConstraint_*> *anchorConstraints;
  undefined4 in_stack_fffffffffffffe28;
  Orientation in_stack_fffffffffffffe2c;
  QSimplexConstraint *in_stack_fffffffffffffe30;
  QSimplexConstraint *this_01;
  double *in_stack_fffffffffffffe38;
  double *in_stack_fffffffffffffe40;
  void *in_stack_fffffffffffffe50;
  void *in_stack_fffffffffffffe58;
  AnchorVertex *in_stack_fffffffffffffe80;
  AnchorVertex *in_stack_fffffffffffffe88;
  int local_98;
  double local_90;
  AnchorData *local_80;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  bVar6 = QList<QtGraphicsAnchorLayout::AnchorData_*>::isEmpty
                    ((QList<QtGraphicsAnchorLayout::AnchorData_*> *)0x940254);
  if (bVar6) {
    memset(in_RDI,0,0x18);
    QList<QSimplexConstraint_*>::QList((QList<QSimplexConstraint_*> *)0x94027b);
  }
  else {
    QList<QtGraphicsAnchorLayout::AnchorData_*>::first
              ((QList<QtGraphicsAnchorLayout::AnchorData_*> *)in_stack_fffffffffffffe30);
    ppAVar9 = QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*>::operator[]
                        ((QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*> *)
                         in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
    if (*ppAVar9 == (AnchorVertex *)0x0) {
      QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>
      ::operator[]((QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>
                    *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*>::operator[]
                ((QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*> *)in_stack_fffffffffffffe30,
                 in_stack_fffffffffffffe2c);
      QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*>::operator[]
                ((QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*> *)in_stack_fffffffffffffe30,
                 in_stack_fffffffffffffe2c);
      local_80 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
                 edgeData((Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>
                           *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe88,
                          in_stack_fffffffffffffe80);
    }
    else {
      QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>
      ::operator[]((QHVContainer<Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>_>
                    *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
      QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*>::operator[]
                ((QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*> *)in_stack_fffffffffffffe30,
                 in_stack_fffffffffffffe2c);
      QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*>::operator[]
                ((QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*> *)in_stack_fffffffffffffe30,
                 in_stack_fffffffffffffe2c);
      local_80 = Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>::
                 edgeData((Graph<QtGraphicsAnchorLayout::AnchorVertex,_QtGraphicsAnchorLayout::AnchorData>
                           *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe88,
                          in_stack_fffffffffffffe80);
    }
    ppAVar9 = QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*>::operator[]
                        ((QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*> *)
                         in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
    iVar8 = 0xffffff;
    if (*ppAVar9 != (AnchorVertex *)0x0) {
      iVar8 = 0x7fffff;
    }
    pAVar4 = local_80->from;
    ppAVar9 = QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*>::operator[]
                        ((QHVContainer<QtGraphicsAnchorLayout::AnchorVertex_*> *)
                         in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
    if (pAVar4 == *ppAVar9) {
      local_90 = local_80->maxSize;
    }
    else {
      local_90 = -local_80->minSize;
    }
    if ((local_90 != (double)iVar8) || (NAN(local_90) || NAN((double)iVar8))) {
      local_80 = (AnchorData *)0x0;
    }
    (in_RDI->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).ptr = (QSimplexConstraint **)&DAT_aaaaaaaaaaaaaaaa;
    (in_RDI->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    QList<QSimplexConstraint_*>::QList((QList<QSimplexConstraint_*> *)0x94051a);
    bVar6 = true;
    for (local_98 = 0; qVar10 = QList<QtGraphicsAnchorLayout::AnchorData_*>::size(in_RDX),
        local_98 < qVar10; local_98 = local_98 + 1) {
      ppAVar11 = QList<QtGraphicsAnchorLayout::AnchorData_*>::at
                           ((QList<QtGraphicsAnchorLayout::AnchorData_*> *)in_stack_fffffffffffffe30
                            ,CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
      pAVar5 = *ppAVar11;
      if (((byte)pAVar5->field_0x78 >> 5 & 3) != 2) {
        pdVar12 = qBound<double>(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                                 (double *)in_stack_fffffffffffffe30);
        dVar1 = *pdVar12;
        pdVar12 = qBound<double>(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38,
                                 (double *)in_stack_fffffffffffffe30);
        dVar2 = *pdVar12;
        if (((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) ||
           (bVar7 = qFuzzyCompare((double)in_stack_fffffffffffffe58,
                                  (double)in_stack_fffffffffffffe50), bVar7)) {
          pvVar13 = operator_new(0x30);
          QSimplexConstraint::QSimplexConstraint(in_stack_fffffffffffffe30);
          QHash<QSimplexVariable_*,_double>::insert
                    (&in_stack_fffffffffffffe30->variables,
                     (QSimplexVariable **)
                     CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                     (double *)0x9406e9);
          *(double *)((long)pvVar13 + 8) = dVar1;
          *(undefined4 *)((long)pvVar13 + 0x10) = 1;
          QList<QSimplexConstraint_*>::operator+=
                    ((QList<QSimplexConstraint_*> *)in_stack_fffffffffffffe30,
                     (parameter_type)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        }
        else {
          pvVar13 = operator_new(0x30);
          QSimplexConstraint::QSimplexConstraint(in_stack_fffffffffffffe30);
          QHash<QSimplexVariable_*,_double>::insert
                    (&in_stack_fffffffffffffe30->variables,
                     (QSimplexVariable **)
                     CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                     (double *)0x9407d1);
          *(double *)((long)pvVar13 + 8) = dVar1;
          *(undefined4 *)((long)pvVar13 + 0x10) = 2;
          QList<QSimplexConstraint_*>::operator+=
                    ((QList<QSimplexConstraint_*> *)in_stack_fffffffffffffe30,
                     (parameter_type)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
          if (pAVar5 == local_80) goto LAB_00940917;
          pvVar13 = operator_new(0x30);
          QSimplexConstraint::QSimplexConstraint(in_stack_fffffffffffffe30);
          in_stack_fffffffffffffe50 = pvVar13;
          in_stack_fffffffffffffe58 = pvVar13;
          QHash<QSimplexVariable_*,_double>::insert
                    (&in_stack_fffffffffffffe30->variables,
                     (QSimplexVariable **)
                     CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                     (double *)0x9408c3);
          *(double *)((long)pvVar13 + 8) = dVar2;
          *(undefined4 *)((long)pvVar13 + 0x10) = 0;
          QList<QSimplexConstraint_*>::operator+=
                    ((QList<QSimplexConstraint_*> *)in_stack_fffffffffffffe30,
                     (parameter_type)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
        }
        bVar6 = false;
      }
LAB_00940917:
    }
    if (bVar6) {
      this_00 = (QSimplexConstraint *)operator_new(0x30);
      QSimplexConstraint::QSimplexConstraint(this_00);
      this_01 = this_00;
      QHash<QSimplexVariable_*,_double>::insert
                (&this_00->variables,
                 (QSimplexVariable **)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                 (double *)0x9409cc);
      this_00->constant = 16777215.0;
      this_00->ratio = LessOrEqual;
      QList<QSimplexConstraint_*>::operator+=
                ((QList<QSimplexConstraint_*> *)this_01,
                 (parameter_type)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QList<QSimplexConstraint *> QGraphicsAnchorLayoutPrivate::constraintsFromSizeHints(
    const QList<AnchorData *> &anchors)
{
    if (anchors.isEmpty())
        return QList<QSimplexConstraint *>();

    // Look for the layout edge. That can be either the first half in case the
    // layout is split in two, or the whole layout anchor.
    const Qt::Orientation orient = anchors.first()->isVertical ? Qt::Vertical : Qt::Horizontal;
    AnchorData *layoutEdge = nullptr;
    if (layoutCentralVertex[orient]) {
        layoutEdge = graph[orient].edgeData(layoutFirstVertex[orient], layoutCentralVertex[orient]);
    } else {
        layoutEdge = graph[orient].edgeData(layoutFirstVertex[orient], layoutLastVertex[orient]);
    }

    // If maxSize is less then "infinite", that means there are other anchors
    // grouped together with this one. We can't ignore its maximum value so we
    // set back the variable to NULL to prevent the continue condition from being
    // satisfied in the loop below.
    const qreal expectedMax = layoutCentralVertex[orient] ? QWIDGETSIZE_MAX / 2 : QWIDGETSIZE_MAX;
    qreal actualMax;
    if (layoutEdge->from == layoutFirstVertex[orient]) {
        actualMax = layoutEdge->maxSize;
    } else {
        actualMax = -layoutEdge->minSize;
    }
    if (actualMax != expectedMax) {
        layoutEdge = nullptr;
    }

    // For each variable, create constraints based on size hints
    QList<QSimplexConstraint *> anchorConstraints;
    bool unboundedProblem = true;
    for (int i = 0; i < anchors.size(); ++i) {
        AnchorData *ad = anchors.at(i);

        // Anchors that have their size directly linked to another one don't need constraints
        // For exammple, the second half of an item has exactly the same size as the first half
        // thus constraining the latter is enough.
        if (ad->dependency == AnchorData::Slave)
            continue;

        // To use negative variables inside simplex, we shift them so the minimum negative value is
        // mapped to zero before solving. To make sure that it works, we need to guarantee that the
        // variables are all inside a certain boundary.
        qreal boundedMin = qBound(-g_offset, ad->minSize, g_offset);
        qreal boundedMax = qBound(-g_offset, ad->maxSize, g_offset);

        if ((boundedMin == boundedMax) || qFuzzyCompare(boundedMin, boundedMax)) {
            QSimplexConstraint *c = new QSimplexConstraint;
            c->variables.insert(ad, 1.0);
            c->constant = boundedMin;
            c->ratio = QSimplexConstraint::Equal;
            anchorConstraints += c;
            unboundedProblem = false;
        } else {
            QSimplexConstraint *c = new QSimplexConstraint;
            c->variables.insert(ad, 1.0);
            c->constant = boundedMin;
            c->ratio = QSimplexConstraint::MoreOrEqual;
            anchorConstraints += c;

            // We avoid adding restrictions to the layout internal anchors. That's
            // to prevent unnecessary fair distribution from happening due to this
            // artificial restriction.
            if (ad == layoutEdge)
                continue;

            c = new QSimplexConstraint;
            c->variables.insert(ad, 1.0);
            c->constant = boundedMax;
            c->ratio = QSimplexConstraint::LessOrEqual;
            anchorConstraints += c;
            unboundedProblem = false;
        }
    }

    // If no upper boundary restriction was added, add one to avoid unbounded problem
    if (unboundedProblem) {
        QSimplexConstraint *c = new QSimplexConstraint;
        c->variables.insert(layoutEdge, 1.0);
        // The maximum size that the layout can take
        c->constant = g_offset;
        c->ratio = QSimplexConstraint::LessOrEqual;
        anchorConstraints += c;
    }

    return anchorConstraints;
}